

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_wrapper.cpp
# Opt level: O0

void __thiscall
daw::cw_details::curl_headers::add_header(curl_headers *this,string_view name,string_view value)

{
  bool bVar1;
  const_pointer pvVar2;
  pointer pcVar3;
  undefined8 uVar4;
  runtime_error *this_00;
  curl_slist *p;
  string local_50 [8];
  string header;
  curl_headers *this_local;
  string_view value_local;
  string_view name_local;
  
  value_local._M_len = (size_t)value._M_str;
  this_local = (curl_headers *)value._M_len;
  value_local._M_str = (char *)name._M_len;
  std::__cxx11::string::string(local_50);
  std::size<std::basic_string_view<char,std::char_traits<char>>>
            ((basic_string_view<char,_std::char_traits<char>_> *)&value_local._M_str);
  std::size<std::basic_string_view<char,std::char_traits<char>>>
            ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  std::__cxx11::string::reserve((ulong)local_50);
  pvVar2 = std::data<std::basic_string_view<char,std::char_traits<char>>>
                     ((basic_string_view<char,_std::char_traits<char>_> *)&value_local._M_str);
  std::size<std::basic_string_view<char,std::char_traits<char>>>
            ((basic_string_view<char,_std::char_traits<char>_> *)&value_local._M_str);
  std::__cxx11::string::append((char *)local_50,(ulong)pvVar2);
  std::__cxx11::string::operator+=(local_50,':');
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  std::basic_string_view<char,_std::char_traits<char>_>::size
            ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  std::__cxx11::string::append((char *)local_50,(ulong)pvVar2);
  pcVar3 = std::unique_ptr<curl_slist,_daw::cw_details::(anonymous_namespace)::curl_slist_deleter>::
           get(&this->m_values);
  uVar4 = std::__cxx11::string::data();
  pcVar3 = (pointer)curl_slist_append(pcVar3,uVar4);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this);
  if (!bVar1) {
    if (pcVar3 == (pointer)0x0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"curl_slist_append should always set list to non_null");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::unique_ptr<curl_slist,_daw::cw_details::(anonymous_namespace)::curl_slist_deleter>::reset
              (&this->m_values,pcVar3);
  }
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void add_header( std::string_view name, std::string_view value ) {
			auto header = std::string( );
			header.reserve( std::size( name ) + std::size( value ) + 1 );
			header.append( std::data( name ), std::size( name ) );
			header += ':';
			header.append( value.data( ), value.size( ) );

			if( auto p = curl_slist_append( m_values.get( ), header.data( ) );
			    not m_values ) {

				if( not p ) {
					throw std::runtime_error(
					  "curl_slist_append should always set list to non_null" );
				}
				m_values.reset( p );
			}
		}